

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O2

TConstUnion __thiscall glslang::TConstUnion::operator+(TConstUnion *this,TConstUnion *constant)

{
  TBasicType TVar1;
  double dVar2;
  TConstUnion TVar3;
  
  TVar1 = this->type;
  if (TVar1 == constant->type) {
    switch(TVar1) {
    case EbtDouble:
      dVar2 = (this->field_0).dConst + (constant->field_0).dConst;
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x1c4,"TConstUnion glslang::TConstUnion::operator+(const TConstUnion &) const")
      ;
    case EbtInt8:
    case EbtUint8:
      dVar2 = (double)(ulong)(byte)((constant->field_0).i8Const + (this->field_0).i8Const);
      break;
    case EbtInt16:
    case EbtUint16:
      dVar2 = (double)(ulong)(ushort)((constant->field_0).i16Const + (this->field_0).i16Const);
      break;
    case EbtInt:
    case EbtUint:
      dVar2 = (double)(ulong)(uint)((constant->field_0).iConst + (this->field_0).iConst);
      break;
    case EbtInt64:
    case EbtUint64:
      dVar2 = (double)((long)&(((this->field_0).sConst)->_M_dataplus).super_allocator_type.allocator
                      + (long)&(((constant->field_0).sConst)->_M_dataplus).super_allocator_type.
                               allocator);
    }
    TVar3.type = TVar1;
    TVar3.field_0.dConst = dVar2;
    TVar3._12_4_ = 0;
    return TVar3;
  }
  __assert_fail("type == constant.type",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                ,0x1b9,"TConstUnion glslang::TConstUnion::operator+(const TConstUnion &) const");
}

Assistant:

TConstUnion operator+(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtInt:    returnValue.setIConst(iConst + constant.iConst); break;
        case EbtUint:   returnValue.setUConst(uConst + constant.uConst); break;
        case EbtDouble: returnValue.setDConst(dConst + constant.dConst); break;
        case EbtInt8:   returnValue.setI8Const(i8Const + constant.i8Const); break;
        case EbtInt16:  returnValue.setI16Const(i16Const + constant.i16Const); break;
        case EbtInt64:  returnValue.setI64Const(i64Const + constant.i64Const); break;
        case EbtUint8:  returnValue.setU8Const(u8Const + constant.u8Const); break;
        case EbtUint16: returnValue.setU16Const(u16Const + constant.u16Const); break;
        case EbtUint64: returnValue.setU64Const(u64Const + constant.u64Const); break;
        default: assert(false && "Default missing");
        }

        return returnValue;
    }